

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O0

void GetProjectCommands(cmState *state)

{
  cmState *pcVar1;
  cmCommand *pcVar2;
  cmDefinePropertyCommand *this;
  cmInstallCommand *this_00;
  cmInstallFilesCommand *this_01;
  cmTargetLinkLibrariesCommand *this_02;
  cmTryRunCommand *this_03;
  cmFLTKWrapUICommand *this_04;
  cmInstallProgramsCommand *this_05;
  cmLoadCacheCommand *this_06;
  cmExportLibraryDependenciesCommand *this_07;
  cmOutputRequiredFilesCommand *this_08;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmState *local_10;
  cmState *state_local;
  
  local_10 = state;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"add_custom_command",&local_31);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddCustomCommandCommand::cmAddCustomCommandCommand((cmAddCustomCommandCommand *)pcVar2);
  cmState::AddBuiltinCommand(state,&local_30,pcVar2);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"add_custom_target",&local_69);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddCustomTargetCommand::cmAddCustomTargetCommand((cmAddCustomTargetCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_68,pcVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"add_definitions",&local_91);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddDefinitionsCommand::cmAddDefinitionsCommand((cmAddDefinitionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_90,pcVar2);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"add_dependencies",&local_b9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddDependenciesCommand::cmAddDependenciesCommand((cmAddDependenciesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_b8,pcVar2);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"add_executable",&local_e1)
  ;
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddExecutableCommand::cmAddExecutableCommand((cmAddExecutableCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"add_library",&local_109);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddLibraryCommand::cmAddLibraryCommand((cmAddLibraryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_108,pcVar2);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"add_subdirectory",&local_131);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddSubDirectoryCommand::cmAddSubDirectoryCommand((cmAddSubDirectoryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_130,pcVar2);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"add_test",&local_159);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddTestCommand::cmAddTestCommand((cmAddTestCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_158,pcVar2);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"build_command",&local_181);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmBuildCommand::cmBuildCommand((cmBuildCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_180,pcVar2);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"create_test_sourcelist",&local_1a9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmCreateTestSourceList::cmCreateTestSourceList((cmCreateTestSourceList *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_1a8,pcVar2);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"define_property",&local_1d1);
  this = (cmDefinePropertyCommand *)operator_new(0x90);
  cmDefinePropertyCommand::cmDefinePropertyCommand(this);
  cmState::AddBuiltinCommand(pcVar1,&local_1d0,(cmCommand *)this);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"enable_language",&local_1f9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmEnableLanguageCommand::cmEnableLanguageCommand((cmEnableLanguageCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_1f8,pcVar2);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"enable_testing",&local_221);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmEnableTestingCommand::cmEnableTestingCommand((cmEnableTestingCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_220,pcVar2);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"get_source_file_property",&local_249);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetSourceFilePropertyCommand::cmGetSourceFilePropertyCommand
            ((cmGetSourceFilePropertyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_248,pcVar2);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"get_target_property",&local_271);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetTargetPropertyCommand::cmGetTargetPropertyCommand((cmGetTargetPropertyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_270,pcVar2);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"get_test_property",&local_299);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmGetTestPropertyCommand::cmGetTestPropertyCommand((cmGetTestPropertyCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_298,pcVar2);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"include_directories",&local_2c1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIncludeDirectoryCommand::cmIncludeDirectoryCommand((cmIncludeDirectoryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_2c0,pcVar2);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"include_regular_expression",&local_2e9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIncludeRegularExpressionCommand::cmIncludeRegularExpressionCommand
            ((cmIncludeRegularExpressionCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_2e8,pcVar2);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"install",&local_311);
  this_00 = (cmInstallCommand *)operator_new(0x50);
  cmInstallCommand::cmInstallCommand(this_00);
  cmState::AddBuiltinCommand(pcVar1,&local_310,(cmCommand *)this_00);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"install_files",&local_339);
  this_01 = (cmInstallFilesCommand *)operator_new(0x88);
  cmInstallFilesCommand::cmInstallFilesCommand(this_01);
  cmState::AddBuiltinCommand(pcVar1,&local_338,(cmCommand *)this_01);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"install_targets",&local_361);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmInstallTargetsCommand::cmInstallTargetsCommand((cmInstallTargetsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_360,pcVar2);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"link_directories",&local_389);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmLinkDirectoriesCommand::cmLinkDirectoriesCommand((cmLinkDirectoriesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_388,pcVar2);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"project",&local_3b1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmProjectCommand::cmProjectCommand((cmProjectCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_3b0,pcVar2);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"set_source_files_properties",&local_3d9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSetSourceFilesPropertiesCommand::cmSetSourceFilesPropertiesCommand
            ((cmSetSourceFilesPropertiesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_3d8,pcVar2);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"set_target_properties",&local_401);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSetTargetPropertiesCommand::cmSetTargetPropertiesCommand((cmSetTargetPropertiesCommand *)pcVar2)
  ;
  cmState::AddBuiltinCommand(pcVar1,&local_400,pcVar2);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"set_tests_properties",&local_429);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSetTestsPropertiesCommand::cmSetTestsPropertiesCommand((cmSetTestsPropertiesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_428,pcVar2);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"subdirs",&local_451);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSubdirCommand::cmSubdirCommand((cmSubdirCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_450,pcVar2);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"target_compile_definitions",&local_479);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetCompileDefinitionsCommand::cmTargetCompileDefinitionsCommand
            ((cmTargetCompileDefinitionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_478,pcVar2);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"target_compile_features",&local_4a1);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetCompileFeaturesCommand::cmTargetCompileFeaturesCommand
            ((cmTargetCompileFeaturesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4a0,pcVar2);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"target_compile_options",&local_4c9);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetCompileOptionsCommand::cmTargetCompileOptionsCommand
            ((cmTargetCompileOptionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4c8,pcVar2);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"target_include_directories",&local_4f1);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetIncludeDirectoriesCommand::cmTargetIncludeDirectoriesCommand
            ((cmTargetIncludeDirectoriesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_4f0,pcVar2);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"target_link_libraries",&local_519);
  this_02 = (cmTargetLinkLibrariesCommand *)operator_new(0x40);
  cmTargetLinkLibrariesCommand::cmTargetLinkLibrariesCommand(this_02);
  cmState::AddBuiltinCommand(pcVar1,&local_518,(cmCommand *)this_02);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"target_sources",&local_541);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetSourcesCommand::cmTargetSourcesCommand((cmTargetSourcesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_540,pcVar2);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"try_compile",&local_569);
  pcVar2 = (cmCommand *)operator_new(0xb0);
  cmTryCompileCommand::cmTryCompileCommand((cmTryCompileCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_568,pcVar2);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"try_run",&local_591);
  this_03 = (cmTryRunCommand *)operator_new(0x150);
  cmTryRunCommand::cmTryRunCommand(this_03);
  cmState::AddBuiltinCommand(pcVar1,&local_590,(cmCommand *)this_03);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"add_compile_definitions",&local_5b9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddCompileDefinitionsCommand::cmAddCompileDefinitionsCommand
            ((cmAddCompileDefinitionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_5b8,pcVar2);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"add_compile_options",&local_5e1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddCompileOptionsCommand::cmAddCompileOptionsCommand((cmAddCompileOptionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_5e0,pcVar2);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"aux_source_directory",&local_609);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAuxSourceDirectoryCommand::cmAuxSourceDirectoryCommand((cmAuxSourceDirectoryCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_608,pcVar2);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"export",&local_631);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmExportCommand::cmExportCommand((cmExportCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_630,pcVar2);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"fltk_wrap_ui",&local_659)
  ;
  this_04 = (cmFLTKWrapUICommand *)operator_new(0x68);
  cmFLTKWrapUICommand::cmFLTKWrapUICommand(this_04);
  cmState::AddBuiltinCommand(pcVar1,&local_658,(cmCommand *)this_04);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"include_external_msproject",&local_681);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmIncludeExternalMSProjectCommand::cmIncludeExternalMSProjectCommand
            ((cmIncludeExternalMSProjectCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_680,pcVar2);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"install_programs",&local_6a9);
  this_05 = (cmInstallProgramsCommand *)operator_new(0x80);
  cmInstallProgramsCommand::cmInstallProgramsCommand(this_05);
  cmState::AddBuiltinCommand(pcVar1,&local_6a8,(cmCommand *)this_05);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"add_link_options",&local_6d1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmAddLinkOptionsCommand::cmAddLinkOptionsCommand((cmAddLinkOptionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_6d0,pcVar2);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"link_libraries",&local_6f9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmLinkLibrariesCommand::cmLinkLibrariesCommand((cmLinkLibrariesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_6f8,pcVar2);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"target_link_options",&local_721);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetLinkOptionsCommand::cmTargetLinkOptionsCommand((cmTargetLinkOptionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_720,pcVar2);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"target_link_directories",&local_749);
  pcVar2 = (cmCommand *)operator_new(0x58);
  cmTargetLinkDirectoriesCommand::cmTargetLinkDirectoriesCommand
            ((cmTargetLinkDirectoriesCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_748,pcVar2);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"load_cache",&local_771);
  this_06 = (cmLoadCacheCommand *)operator_new(0x80);
  cmLoadCacheCommand::cmLoadCacheCommand(this_06);
  cmState::AddBuiltinCommand(pcVar1,&local_770,(cmCommand *)this_06);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"qt_wrap_cpp",&local_799);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmQTWrapCPPCommand::cmQTWrapCPPCommand((cmQTWrapCPPCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_798,pcVar2);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"qt_wrap_ui",&local_7c1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmQTWrapUICommand::cmQTWrapUICommand((cmQTWrapUICommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_7c0,pcVar2);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"remove_definitions",&local_7e9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmRemoveDefinitionsCommand::cmRemoveDefinitionsCommand((cmRemoveDefinitionsCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_7e8,pcVar2);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"source_group",&local_811)
  ;
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSourceGroupCommand::cmSourceGroupCommand((cmSourceGroupCommand *)pcVar2);
  cmState::AddBuiltinCommand(pcVar1,&local_810,pcVar2);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"export_library_dependencies",&local_839);
  this_07 = (cmExportLibraryDependenciesCommand *)operator_new(0x58);
  cmExportLibraryDependenciesCommand::cmExportLibraryDependenciesCommand(this_07);
  cmState::AddDisallowedCommand
            (pcVar1,&local_838,(cmCommand *)this_07,CMP0033,
             "The export_library_dependencies command should not be called; see CMP0033.");
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"load_command",&local_861)
  ;
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmLoadCommandCommand::cmLoadCommandCommand((cmLoadCommandCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_860,pcVar2,CMP0031,
             "The load_command command should not be called; see CMP0031.");
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"output_required_files",&local_889);
  this_08 = (cmOutputRequiredFilesCommand *)operator_new(0x70);
  cmOutputRequiredFilesCommand::cmOutputRequiredFilesCommand(this_08);
  cmState::AddDisallowedCommand
            (pcVar1,&local_888,(cmCommand *)this_08,CMP0032,
             "The output_required_files command should not be called; see CMP0032.");
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"subdir_depends",&local_8b1);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmSubdirDependsCommand::cmSubdirDependsCommand((cmSubdirDependsCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_8b0,pcVar2,CMP0029,
             "The subdir_depends command should not be called; see CMP0029.");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"utility_source",&local_8d9);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmUtilitySourceCommand::cmUtilitySourceCommand((cmUtilitySourceCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_8d8,pcVar2,CMP0034,
             "The utility_source command should not be called; see CMP0034.");
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"variable_requires",&local_901);
  pcVar2 = (cmCommand *)operator_new(0x30);
  cmVariableRequiresCommand::cmVariableRequiresCommand((cmVariableRequiresCommand *)pcVar2);
  cmState::AddDisallowedCommand
            (pcVar1,&local_900,pcVar2,CMP0035,
             "The variable_requires command should not be called; see CMP0035.");
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  return;
}

Assistant:

void GetProjectCommands(cmState* state)
{
  state->AddBuiltinCommand("add_custom_command",
                           new cmAddCustomCommandCommand);
  state->AddBuiltinCommand("add_custom_target", new cmAddCustomTargetCommand);
  state->AddBuiltinCommand("add_definitions", new cmAddDefinitionsCommand);
  state->AddBuiltinCommand("add_dependencies", new cmAddDependenciesCommand);
  state->AddBuiltinCommand("add_executable", new cmAddExecutableCommand);
  state->AddBuiltinCommand("add_library", new cmAddLibraryCommand);
  state->AddBuiltinCommand("add_subdirectory", new cmAddSubDirectoryCommand);
  state->AddBuiltinCommand("add_test", new cmAddTestCommand);
  state->AddBuiltinCommand("build_command", new cmBuildCommand);
  state->AddBuiltinCommand("create_test_sourcelist",
                           new cmCreateTestSourceList);
  state->AddBuiltinCommand("define_property", new cmDefinePropertyCommand);
  state->AddBuiltinCommand("enable_language", new cmEnableLanguageCommand);
  state->AddBuiltinCommand("enable_testing", new cmEnableTestingCommand);
  state->AddBuiltinCommand("get_source_file_property",
                           new cmGetSourceFilePropertyCommand);
  state->AddBuiltinCommand("get_target_property",
                           new cmGetTargetPropertyCommand);
  state->AddBuiltinCommand("get_test_property", new cmGetTestPropertyCommand);
  state->AddBuiltinCommand("include_directories",
                           new cmIncludeDirectoryCommand);
  state->AddBuiltinCommand("include_regular_expression",
                           new cmIncludeRegularExpressionCommand);
  state->AddBuiltinCommand("install", new cmInstallCommand);
  state->AddBuiltinCommand("install_files", new cmInstallFilesCommand);
  state->AddBuiltinCommand("install_targets", new cmInstallTargetsCommand);
  state->AddBuiltinCommand("link_directories", new cmLinkDirectoriesCommand);
  state->AddBuiltinCommand("project", new cmProjectCommand);
  state->AddBuiltinCommand("set_source_files_properties",
                           new cmSetSourceFilesPropertiesCommand);
  state->AddBuiltinCommand("set_target_properties",
                           new cmSetTargetPropertiesCommand);
  state->AddBuiltinCommand("set_tests_properties",
                           new cmSetTestsPropertiesCommand);
  state->AddBuiltinCommand("subdirs", new cmSubdirCommand);
  state->AddBuiltinCommand("target_compile_definitions",
                           new cmTargetCompileDefinitionsCommand);
  state->AddBuiltinCommand("target_compile_features",
                           new cmTargetCompileFeaturesCommand);
  state->AddBuiltinCommand("target_compile_options",
                           new cmTargetCompileOptionsCommand);
  state->AddBuiltinCommand("target_include_directories",
                           new cmTargetIncludeDirectoriesCommand);
  state->AddBuiltinCommand("target_link_libraries",
                           new cmTargetLinkLibrariesCommand);
  state->AddBuiltinCommand("target_sources", new cmTargetSourcesCommand);
  state->AddBuiltinCommand("try_compile", new cmTryCompileCommand);
  state->AddBuiltinCommand("try_run", new cmTryRunCommand);

#if defined(CMAKE_BUILD_WITH_CMAKE)
  state->AddBuiltinCommand("add_compile_definitions",
                           new cmAddCompileDefinitionsCommand);
  state->AddBuiltinCommand("add_compile_options",
                           new cmAddCompileOptionsCommand);
  state->AddBuiltinCommand("aux_source_directory",
                           new cmAuxSourceDirectoryCommand);
  state->AddBuiltinCommand("export", new cmExportCommand);
  state->AddBuiltinCommand("fltk_wrap_ui", new cmFLTKWrapUICommand);
  state->AddBuiltinCommand("include_external_msproject",
                           new cmIncludeExternalMSProjectCommand);
  state->AddBuiltinCommand("install_programs", new cmInstallProgramsCommand);
  state->AddBuiltinCommand("add_link_options", new cmAddLinkOptionsCommand);
  state->AddBuiltinCommand("link_libraries", new cmLinkLibrariesCommand);
  state->AddBuiltinCommand("target_link_options",
                           new cmTargetLinkOptionsCommand);
  state->AddBuiltinCommand("target_link_directories",
                           new cmTargetLinkDirectoriesCommand);
  state->AddBuiltinCommand("load_cache", new cmLoadCacheCommand);
  state->AddBuiltinCommand("qt_wrap_cpp", new cmQTWrapCPPCommand);
  state->AddBuiltinCommand("qt_wrap_ui", new cmQTWrapUICommand);
  state->AddBuiltinCommand("remove_definitions",
                           new cmRemoveDefinitionsCommand);
  state->AddBuiltinCommand("source_group", new cmSourceGroupCommand);

  state->AddDisallowedCommand(
    "export_library_dependencies", new cmExportLibraryDependenciesCommand,
    cmPolicies::CMP0033,
    "The export_library_dependencies command should not be called; "
    "see CMP0033.");
  state->AddDisallowedCommand(
    "load_command", new cmLoadCommandCommand, cmPolicies::CMP0031,
    "The load_command command should not be called; see CMP0031.");
  state->AddDisallowedCommand(
    "output_required_files", new cmOutputRequiredFilesCommand,
    cmPolicies::CMP0032,
    "The output_required_files command should not be called; see CMP0032.");
  state->AddDisallowedCommand(
    "subdir_depends", new cmSubdirDependsCommand, cmPolicies::CMP0029,
    "The subdir_depends command should not be called; see CMP0029.");
  state->AddDisallowedCommand(
    "utility_source", new cmUtilitySourceCommand, cmPolicies::CMP0034,
    "The utility_source command should not be called; see CMP0034.");
  state->AddDisallowedCommand(
    "variable_requires", new cmVariableRequiresCommand, cmPolicies::CMP0035,
    "The variable_requires command should not be called; see CMP0035.");
#endif
}